

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O1

void __thiscall
obs::safe_list<obs::slot<void_(int)>_>::iterator::iterator
          (iterator *this,safe_list<obs::slot<void_(int)>_> *list,node *node)

{
  atomic<int> *paVar1;
  int iVar2;
  
  this->m_list = list;
  this->m_node = node;
  this->m_value = (slot<void_(int)> *)0x0;
  this->m_locked = false;
  this->m_next_iterator = (iterator *)0x0;
  LOCK();
  paVar1 = &list->m_ref;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<int>)._M_i == 0 ||
      SCARRY4(iVar2,1) != (paVar1->super___atomic_base<int>)._M_i < 0) {
    __assert_fail("v >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                  ,0x161,
                  "void obs::safe_list<obs::slot<void (int)>>::ref() [T = obs::slot<void (int)>]");
  }
  if (this->m_node == (node *)0x0) {
    return;
  }
  if (this->m_locked == false) {
    if (this->m_node == (node *)0x0) {
      __assert_fail("m_node",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                    ,0xee,
                    "void obs::safe_list<obs::slot<void (int)>>::iterator::lock() [T = obs::slot<void (int)>]"
                   );
    }
    safe_list<obs::slot<void_(int)>_>::node::lock(this->m_node,this);
    this->m_value = this->m_node->value;
    this->m_locked = true;
  }
  return;
}

Assistant:

iterator(safe_list& list, node* node)
      : m_list(list),
        m_node(node) {
      m_list.ref();

      // Lock the node because this iterator is pointing to it.
      if (m_node)
        lock();
    }